

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

panel * get_panel_midleft(void)

{
  wchar_t wVar1;
  uint8_t attr_00;
  uint8_t uVar2;
  wchar_t wVar3;
  panel *p_00;
  char *pcVar4;
  uint8_t attr;
  wchar_t diff;
  panel *p;
  
  p_00 = panel_allocate(L'\t');
  wVar3 = weight_remaining(player);
  attr_00 = '\r';
  if (wVar3 < L'\0') {
    attr_00 = '\f';
  }
  uVar2 = max_color((int)player->lev,(int)player->max_lev);
  panel_line(p_00,uVar2,"Level","%d",(ulong)(uint)(int)player->lev);
  uVar2 = max_color(player->exp,player->max_exp);
  panel_line(p_00,uVar2,"Cur Exp","%d",(ulong)(uint)player->exp);
  panel_line(p_00,'\r',"Max Exp","%d",(ulong)(uint)player->max_exp);
  pcVar4 = show_adv_exp();
  panel_line(p_00,'\r',"Adv Exp","%s",pcVar4);
  panel_space(p_00);
  panel_line(p_00,'\r',"Gold","%d",(ulong)(uint)player->au);
  panel_line(p_00,attr_00,"Burden","%.1f lb",(double)((float)player->upkeep->total_weight / 10.0));
  wVar1 = wVar3;
  if (wVar3 < L'\x01') {
    wVar1 = -wVar3;
  }
  panel_line(p_00,attr_00,"Overweight","%d.%d lb",(long)-wVar3 / 10 & 0xffffffff,
             (long)wVar1 % 10 & 0xffffffff);
  pcVar4 = show_depth();
  panel_line(p_00,'\r',"Max Depth","%s",pcVar4);
  return p_00;
}

Assistant:

static struct panel *get_panel_midleft(void) {
	struct panel *p = panel_allocate(9);
	int diff = weight_remaining(player);
	uint8_t attr = diff < 0 ? COLOUR_L_RED : COLOUR_L_GREEN;

	panel_line(p, max_color(player->lev, player->max_lev),
			"Level", "%d", player->lev);
	panel_line(p, max_color(player->exp, player->max_exp),
			"Cur Exp", "%d", player->exp);
	panel_line(p, COLOUR_L_GREEN, "Max Exp", "%d", player->max_exp);
	panel_line(p, COLOUR_L_GREEN, "Adv Exp", "%s", show_adv_exp());
	panel_space(p);
	panel_line(p, COLOUR_L_GREEN, "Gold", "%d", player->au);
	panel_line(p, attr, "Burden", "%.1f lb",
			   player->upkeep->total_weight / 10.0F);
	panel_line(p, attr, "Overweight", "%d.%d lb", -diff / 10, abs(diff) % 10);
	panel_line(p, COLOUR_L_GREEN, "Max Depth", "%s", show_depth());

	return p;
}